

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_file_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  __off_t _Var2;
  long __off;
  mz_int64 cur_ofs;
  mz_zip_archive *pZip;
  size_t n_local;
  void *pBuf_local;
  mz_uint64 file_ofs_local;
  void *pOpaque_local;
  
  _Var2 = ftello(*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70));
  __off = *(long *)(*(long *)((long)pOpaque + 0x68) + 0x78) + file_ofs;
  if (__off < 0) {
LAB_001140c6:
    if (pOpaque != (void *)0x0) {
      *(undefined4 *)((long)pOpaque + 0x1c) = 0x16;
    }
    pOpaque_local = (void *)0x0;
  }
  else {
    if (_Var2 != __off) {
      iVar1 = fseeko(*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70),__off,0);
      if (iVar1 != 0) goto LAB_001140c6;
    }
    pOpaque_local = (void *)fwrite(pBuf,1,n,*(FILE **)(*(long *)((long)pOpaque + 0x68) + 0x70));
  }
  return (size_t)pOpaque_local;
}

Assistant:

static size_t mz_zip_file_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);

  file_ofs += pZip->m_pState->m_file_archive_start_ofs;

  if (((mz_int64)file_ofs < 0) ||
      (((cur_ofs != (mz_int64)file_ofs)) &&
       (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET)))) {
    mz_zip_set_error(pZip, MZ_ZIP_FILE_SEEK_FAILED);
    return 0;
  }

  return MZ_FWRITE(pBuf, 1, n, pZip->m_pState->m_pFile);
}